

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O1

int * Abc_MergeSortCost(int *pCosts,int nSize)

{
  size_t __size;
  int *piVar1;
  int *pInBeg;
  int *pOutBeg;
  ulong uVar2;
  
  piVar1 = (int *)calloc(4,(long)nSize);
  if (1 < nSize) {
    __size = (long)nSize * 8;
    pInBeg = (int *)malloc(__size);
    pOutBeg = (int *)malloc(__size);
    uVar2 = 0;
    do {
      pInBeg[uVar2 * 2] = (int)uVar2;
      pInBeg[uVar2 * 2 + 1] = pCosts[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)nSize != uVar2);
    Abc_MergeSortCost_rec(pInBeg,pInBeg + (uint)(nSize * 2),pOutBeg);
    uVar2 = 0;
    do {
      piVar1[uVar2] = pInBeg[uVar2 * 2];
      uVar2 = uVar2 + 1;
    } while ((uint)nSize != uVar2);
    free(pOutBeg);
    free(pInBeg);
  }
  return piVar1;
}

Assistant:

int * Abc_MergeSortCost( int * pCosts, int nSize )
{
    int i, * pResult, * pInput, * pOutput;
    pResult = (int *) calloc( sizeof(int), nSize );
    if ( nSize < 2 )
        return pResult;
    pInput  = (int *) malloc( sizeof(int) * 2 * nSize );
    pOutput = (int *) malloc( sizeof(int) * 2 * nSize );
    for ( i = 0; i < nSize; i++ )
        pInput[2*i] = i, pInput[2*i+1] = pCosts[i];
    Abc_MergeSortCost_rec( pInput, pInput + 2*nSize, pOutput );
    for ( i = 0; i < nSize; i++ )
        pResult[i] = pInput[2*i];
    free( pOutput );
    free( pInput );
    return pResult;
}